

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O1

void __thiscall FileWriter::logTime(FileWriter *this,Timer *t)

{
  long lVar1;
  long lVar2;
  ostream *poVar3;
  char cVar4;
  duration<double,_std::ratio<1L,_1L>_> dVar5;
  
  lVar2 = std::cout;
  poVar3 = (ostream *)&std::cout;
  lVar1 = *(long *)(std::cout + -0x18);
  cVar4 = (char)lVar1 + -0x38;
  if (t != (Timer *)0x0) {
    *(uint *)(std::__cxx11::string::operator= + lVar1) =
         *(uint *)(std::__cxx11::string::operator= + lVar1) & 0xfffffefb | 4;
    *(undefined8 *)(__ctype_tolower_loc + *(long *)(lVar2 + -0x18)) = 3;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (took ",7);
    dVar5 = Timer::elapsed(t);
    poVar3 = std::ostream::_M_insert<double>(dVar5.__r);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"s)",2);
    cVar4 = (char)poVar3 + (char)*(undefined8 *)(*(long *)poVar3 + -0x18);
  }
  std::ios::widen(cVar4);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

void FileWriter::logTime(const Timer* t) {
  if (t) {
    std::cout
      << std::fixed
      << std::setprecision(3)
      << " (took "
      << t->elapsed().count()
      << "s)"
      << std::endl;
  } else {
    std::cout << std::endl;
  }
}